

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmWrap<cmGraphEdgeList>
                   (string *__return_storage_ptr__,string_view prefix,cmGraphEdgeList *rng,
                   string_view suffix,string_view sep)

{
  string_view separator;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string local_f8;
  string local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_b8;
  size_type local_a0;
  pointer local_98;
  undefined8 local_90;
  size_t local_88;
  char *local_80;
  undefined8 local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_70;
  size_t local_58;
  char *pcStack_50;
  undefined8 local_48;
  size_t local_40;
  char *local_38;
  undefined8 local_30;
  
  local_b8.first._M_str = prefix._M_str;
  local_b8.first._M_len = prefix._M_len;
  if ((rng->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (rng->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
      super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_b8.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_70.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_58 = sep._M_len;
    pcStack_50 = sep._M_str;
    local_48 = 0;
    local_30 = 0;
    views._M_len = 3;
    views._M_array = &local_70;
    local_70.first._M_len = suffix._M_len;
    local_70.first._M_str = suffix._M_str;
    local_40 = local_b8.first._M_len;
    local_38 = local_b8.first._M_str;
    cmCatViews(&local_d8,views);
    separator._M_str = local_d8._M_dataplus._M_p;
    separator._M_len = local_d8._M_string_length;
    cmJoin<cmGraphEdgeList>(&local_f8,rng,separator);
    local_a0 = local_f8._M_string_length;
    local_98 = local_f8._M_dataplus._M_p;
    local_90 = 0;
    local_78 = 0;
    views_00._M_len = 3;
    views_00._M_array = &local_b8;
    local_88 = suffix._M_len;
    local_80 = suffix._M_str;
    cmCatViews(__return_storage_ptr__,views_00);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmWrap(cm::string_view prefix, Range const& rng,
                   cm::string_view suffix, cm::string_view sep)
{
  if (rng.empty()) {
    return std::string();
  }
  return cmCatViews({ { prefix, nullptr },
                      { cmJoin(rng,
                               cmCatViews({ { suffix, nullptr },
                                            { sep, nullptr },
                                            { prefix, nullptr } })),
                        nullptr },
                      { suffix, nullptr } });
}